

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

NULLCRef * NULLCVector::VectorFront(NULLCRef *__return_storage_ptr__,vector *vec)

{
  uint uVar1;
  uint uVar2;
  char **ppcVar3;
  
  *(undefined4 *)((long)&__return_storage_ptr__->ptr + 4) = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  if (vec->size == 0) {
    nullcThrowError("vector::front called on an empty vector");
    return __return_storage_ptr__;
  }
  if (vec->flags == 0) {
    __return_storage_ptr__->typeID = vec->elemType;
  }
  else {
    uVar2 = nullcGetSubType(0);
    uVar1 = vec->flags;
    __return_storage_ptr__->typeID = uVar2;
    if (uVar1 != 0) {
      ppcVar3 = (char **)(vec->data).ptr;
      goto LAB_0022eca0;
    }
  }
  ppcVar3 = &(vec->data).ptr;
LAB_0022eca0:
  __return_storage_ptr__->ptr = *ppcVar3;
  return __return_storage_ptr__;
}

Assistant:

NULLCRef VectorFront(vector* vec)
	{
		NULLCRef ret = { 0, 0 };
		if(!vec->size)
		{
			nullcThrowError("vector::front called on an empty vector");
			return ret;
		}
		ret.typeID = (vec->flags ? nullcGetSubType(vec->elemType) : vec->elemType);
		ret.ptr = vec->flags ? *(char**)vec->data.ptr : vec->data.ptr;
		return ret;
	}